

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTTGame.cpp
# Opt level: O3

void __thiscall TTTGame::TTTGame(TTTGame *this,string *name,Player *player1)

{
  pointer pcVar1;
  
  Player::Player(&this->m_player1,player1);
  Player::Player(&this->m_player2,-1);
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar1,pcVar1 + name->_M_string_length);
  return;
}

Assistant:

TTTGame::TTTGame(string name, Player player1)
    : m_player1(player1), m_player2(-1), m_name(name)
{ }